

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O3

error_or<unsigned_long> * __thiscall
pstore::romfs::open_file::seek
          (error_or<unsigned_long> *__return_storage_ptr__,open_file *this,off_t offset,
          seek_mode whence)

{
  error_code *peVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  
  if (whence == end) {
    uVar2 = (this->dir_->stat_).size;
    if (uVar2 < (ulong)-offset && offset < 0) {
LAB_001444b0:
      get_romfs_error_category();
      __return_storage_ptr__->has_error_ = true;
      peVar1 = error_or<unsigned_long>::
               error_storage_impl<pstore::error_or<unsigned_long>&,std::error_code>
                         (__return_storage_ptr__);
      peVar1->_M_value = 0x16;
      peVar1->_M_cat = &get_romfs_error_category::cat.super_error_category;
      return __return_storage_ptr__;
    }
  }
  else {
    if (whence != cur) {
      if (whence == set) {
        if (offset < 0) goto LAB_001444b0;
      }
      else {
        offset = 0;
      }
      goto LAB_001444eb;
    }
    if (-1 < offset) {
      offset = offset + this->pos_;
      goto LAB_001444eb;
    }
    uVar2 = this->pos_;
    if (uVar2 < (ulong)-offset) goto LAB_001444b0;
  }
  offset = offset + uVar2;
LAB_001444eb:
  this->pos_ = offset;
  __return_storage_ptr__->has_error_ = false;
  puVar3 = error_or<unsigned_long>::
           value_storage_impl<pstore::error_or<unsigned_long>&,unsigned_long>
                     (__return_storage_ptr__);
  *puVar3 = offset;
  return __return_storage_ptr__;
}

Assistant:

error_or<std::size_t> open_file::seek (off_t const offset, seek_mode const whence) {
            auto make_error = [] (error_code const erc) {
                return error_or<std::size_t> (make_error_code (erc));
            };
            using uoff_type = std::make_unsigned<off_t>::type;
            std::size_t new_pos = 0;
            std::size_t const file_size = dir_.stat ().size;
            switch (whence) {
            case seek_mode::set:
                if (offset < 0) {
                    return make_error (error_code::einval);
                }
                new_pos = static_cast<uoff_type> (offset);
                break;
            case seek_mode::cur:
                if (offset < 0) {
                    auto const positive_offset = static_cast<uoff_type> (-offset);
                    if (positive_offset > pos_) {
                        return make_error (error_code::einval);
                    }
                    new_pos = pos_ - positive_offset;
                } else {
                    new_pos = pos_ + static_cast<uoff_type> (offset);
                }
                break;
            case seek_mode::end:
                if (offset < 0 && static_cast<std::size_t> (-offset) > file_size) {
                    return make_error (error_code::einval);
                }
                new_pos = (offset >= 0) ? (file_size + static_cast<uoff_type> (offset))
                                        : (file_size - static_cast<uoff_type> (-offset));
                break;
            }

            pos_ = new_pos;
            return error_or<std::size_t>{new_pos};
        }